

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::DoInterruptProbes(Lowerer *this)

{
  Func *pFVar1;
  Instr *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  LabelInstr *this_01;
  LabelInstr *loopLabel;
  Instr **ppIVar6;
  uint32 number;
  
  pFVar1 = this->m_func;
  pFVar1->topFunc->hasInstrNumber = true;
  ppIVar6 = &pFVar1->m_headInstr;
  number = 1;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pIVar5 = (Instr *)0x0;
  do {
    this_00 = *ppIVar6;
    if (this_00 == (Instr *)0x0) {
      return;
    }
    if ((pIVar5 != (Instr *)0x0) && (pIVar5->m_next != this_00)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x157c,
                         "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    IR::Instr::SetNumber(this_00,number);
    if ((this_00->m_kind == InstrKindProfiledLabel) || (this_00->m_kind == InstrKindLabel)) {
      this_01 = IR::Instr::AsLabelInstr(this_00);
      if ((this_01->field_0x78 & 1) != 0) {
        loopLabel = IR::LabelInstr::New(Label,this->m_func,false);
        IR::Instr::InsertAfter(&this_01->super_Instr,&loopLabel->super_Instr);
        InsertOneLoopProbe(this,&loopLabel->super_Instr,loopLabel);
      }
    }
    ppIVar6 = &this_00->m_next;
    number = number + 1;
    pIVar5 = this_00;
  } while( true );
}

Assistant:

void
Lowerer::DoInterruptProbes()
{
    this->m_func->SetHasInstrNumber(true);
    uint instrCount = 1;
    FOREACH_INSTR_IN_FUNC(instr, this->m_func)
    {
        instr->SetNumber(instrCount++);
        if (instr->IsLabelInstr())
        {
            IR::LabelInstr *labelInstr = instr->AsLabelInstr();
            if (labelInstr->m_isLoopTop)
            {
                // For every loop top label, insert the following:

                //   cmp sp, ThreadContext::stackLimitForCurrentThread
                //   bgt $continue
                // $helper:
                //   call JavascriptOperators::ScriptAbort
                //   b $exit
                // $continue:

                IR::LabelInstr *newLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
                labelInstr->InsertAfter(newLabel);
                this->InsertOneLoopProbe(newLabel, newLabel);
            }
        }
    }
    NEXT_INSTR_IN_FUNC;
}